

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O2

void predict<true>(mf *data,single_learner *base,example *ec)

{
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  pointer pbVar4;
  pointer pbVar5;
  features *pfVar6;
  size_t k;
  ulong i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float fVar7;
  float local_5c;
  uchar local_55;
  float local_54;
  v_array<unsigned_char> *local_50;
  features *local_48;
  pointer local_40;
  pointer local_38;
  
  v_array<float>::resize(&data->sub_predictions,data->rank * 2 + 1);
  LEARNER::learner<char,_example>::predict(base,ec,0);
  local_5c = ec->partial_prediction;
  *(data->sub_predictions)._begin = local_5c;
  local_5c = local_5c + 0.0;
  local_50 = &data->predict_indices;
  copy_array<unsigned_char>(local_50,(v_array<unsigned_char> *)ec);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  local_55 = '\0';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_55);
  pbVar5 = (data->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pfVar6 = (ec->super_example_predict).feature_space;
  local_48 = pfVar6;
  local_40 = pbVar5;
  for (pbVar4 = (data->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar5; pbVar4 = pbVar4 + 1) {
    puVar3 = (uchar *)(pbVar4->_M_dataplus)._M_p;
    uVar1 = *puVar3;
    if ((pfVar6[(char)uVar1].values._end != pfVar6[(char)uVar1].values._begin) &&
       (uVar2 = puVar3[1], pfVar6[(char)uVar2].values._end != pfVar6[(char)uVar2].values._begin)) {
      local_38 = pbVar4;
      for (i = 1; pbVar4 = local_38, pbVar5 = local_40, pfVar6 = local_48, i <= data->rank;
          i = i + 1) {
        *(ec->super_example_predict).indices._begin = uVar1;
        LEARNER::learner<char,_example>::predict(base,ec,i);
        local_54 = ec->partial_prediction;
        (data->sub_predictions)._begin[i * 2 + -1] = local_54;
        *(ec->super_example_predict).indices._begin = uVar2;
        LEARNER::learner<char,_example>::predict(base,ec,data->rank + i);
        fVar7 = ec->partial_prediction;
        (data->sub_predictions)._begin[i * 2] = fVar7;
        local_5c = local_5c + local_54 * fVar7;
      }
    }
  }
  copy_array<unsigned_char>((v_array<unsigned_char> *)ec,local_50);
  ec->partial_prediction = local_5c;
  fVar7 = GD::finalize_prediction(data->all->sd,local_5c);
  (ec->pred).scalar = fVar7;
  return;
}

Assistant:

void predict(mf& data, single_learner& base, example& ec)
{
  float prediction = 0;
  if (cache_sub_predictions)
    data.sub_predictions.resize(2 * data.rank + 1);

  // predict from linear terms
  base.predict(ec);

  // store linear prediction
  if (cache_sub_predictions)
    data.sub_predictions[0] = ec.partial_prediction;
  prediction += ec.partial_prediction;

  // store namespace indices
  copy_array(data.predict_indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // add interaction terms to prediction
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      for (size_t k = 1; k <= data.rank; k++)
      {
        ec.indices[0] = left_ns;

        // compute l^k * x_l using base learner
        base.predict(ec, k);
        float x_dot_l = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k - 1] = x_dot_l;

        // set example to right namespace only
        ec.indices[0] = right_ns;

        // compute r^k * x_r using base learner
        base.predict(ec, k + data.rank);
        float x_dot_r = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k] = x_dot_r;

        // accumulate prediction
        prediction += (x_dot_l * x_dot_r);
      }
    }
  }
  // restore namespace indices and label
  copy_array(ec.indices, data.predict_indices);

  // finalize prediction
  ec.partial_prediction = prediction;
  ec.pred.scalar = GD::finalize_prediction(data.all->sd, ec.partial_prediction);
}